

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_1_3_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  float *data;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  long lVar35;
  float *pfVar36;
  long lVar37;
  float *pfVar38;
  int iVar39;
  int iVar40;
  long lVar41;
  long lVar42;
  int iVar43;
  int iVar44;
  float *pfVar45;
  int k_count;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  float fVar59;
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  undefined1 auVar74 [16];
  float fVar75;
  undefined1 auVar76 [12];
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  int l0_1;
  int l_count0_1;
  int data_width;
  int l0;
  int l_count0;
  
  auVar53._8_4_ = 0x80000000;
  auVar53._0_8_ = 0x8000000080000000;
  auVar53._12_4_ = 0x80000000;
  auVar54._8_4_ = 0x3effffff;
  auVar54._0_8_ = 0x3effffff3effffff;
  auVar54._12_4_ = 0x3effffff;
  fVar60 = ipoint->scale;
  auVar79 = ZEXT464((uint)fVar60);
  auVar46 = vpternlogd_avx512vl(auVar54,ZEXT416((uint)fVar60),auVar53,0xf8);
  auVar46 = ZEXT416((uint)(fVar60 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  iVar43 = (int)auVar46._0_4_;
  fVar59 = -0.08 / (fVar60 * fVar60);
  auVar47 = vpternlogd_avx512vl(auVar54,ZEXT416((uint)ipoint->x),auVar53,0xf8);
  auVar47 = ZEXT416((uint)(ipoint->x + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48._0_8_ = (double)auVar47._0_4_;
  auVar48._8_8_ = auVar47._8_8_;
  auVar52._0_8_ = (double)fVar60;
  auVar52._8_8_ = 0;
  auVar47 = vfmadd231sd_fma(auVar48,auVar52,ZEXT816(0x3fe0000000000000));
  auVar51._0_4_ = (float)auVar47._0_8_;
  auVar51._4_12_ = auVar47._4_12_;
  auVar47 = vpternlogd_avx512vl(auVar54,ZEXT416((uint)ipoint->y),auVar53,0xf8);
  auVar47 = ZEXT416((uint)(ipoint->y + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar49._0_8_ = (double)auVar47._0_4_;
  auVar49._8_8_ = auVar47._8_8_;
  auVar47 = vfmadd231sd_fma(auVar49,auVar52,ZEXT816(0x3fe0000000000000));
  auVar50._0_4_ = (float)auVar47._0_8_;
  auVar50._4_12_ = auVar47._4_12_;
  auVar47._0_4_ = (int)auVar46._0_4_;
  auVar47._4_4_ = (int)auVar46._4_4_;
  auVar47._8_4_ = (int)auVar46._8_4_;
  auVar47._12_4_ = (int)auVar46._12_4_;
  auVar46 = vcvtdq2ps_avx(auVar47);
  fVar3 = auVar51._0_4_ - auVar46._0_4_;
  fVar4 = auVar50._0_4_ - auVar46._0_4_;
  auVar46 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar60),auVar51);
  auVar47 = vpternlogd_avx512vl(auVar54,auVar46,auVar53,0xf8);
  auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar47._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = ZEXT416((uint)fVar60);
  if (iVar43 < (int)auVar46._0_4_) {
    auVar46 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar47,auVar50);
    auVar55._8_4_ = 0x3effffff;
    auVar55._0_8_ = 0x3effffff3effffff;
    auVar55._12_4_ = 0x3effffff;
    auVar56._8_4_ = 0x80000000;
    auVar56._0_8_ = 0x8000000080000000;
    auVar56._12_4_ = 0x80000000;
    auVar48 = vpternlogd_avx512vl(auVar56,auVar46,auVar55,0xea);
    auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar48._0_4_));
    auVar46 = vroundss_avx(auVar46,auVar46,0xb);
    if (iVar43 < (int)auVar46._0_4_) {
      auVar46 = vfmadd231ss_fma(auVar51,auVar47,ZEXT416(0x41300000));
      auVar57._8_4_ = 0x80000000;
      auVar57._0_8_ = 0x8000000080000000;
      auVar57._12_4_ = 0x80000000;
      auVar48 = vpternlogd_avx512vl(auVar57,auVar46,auVar55,0xea);
      auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar48._0_4_));
      auVar46 = vroundss_avx(auVar46,auVar46,0xb);
      if ((int)auVar46._0_4_ + iVar43 <= iimage->width) {
        auVar46 = vfmadd231ss_fma(auVar50,auVar47,ZEXT416(0x41300000));
        auVar14._8_4_ = 0x80000000;
        auVar14._0_8_ = 0x8000000080000000;
        auVar14._12_4_ = 0x80000000;
        auVar48 = vpternlogd_avx512vl(auVar55,auVar46,auVar14,0xf8);
        auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar48._0_4_));
        auVar46 = vroundss_avx(auVar46,auVar46,0xb);
        if ((int)auVar46._0_4_ + iVar43 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          pfVar36 = iimage->data;
          iVar1 = iimage->data_width;
          iVar16 = iVar43 * 2;
          pfVar45 = haarResponseY + 2;
          pfVar38 = haarResponseX + 2;
          iVar32 = -0xc;
          lVar22 = 0;
          do {
            auVar46._0_4_ = (float)iVar32;
            auVar76 = in_ZMM9._4_12_;
            auVar46._4_12_ = auVar76;
            auVar46 = vfmadd213ss_fma(auVar46,auVar47,ZEXT416((uint)(fVar4 + 0.5)));
            iVar17 = (int)auVar46._0_4_;
            iVar18 = (iVar17 + -1) * iVar1;
            iVar19 = (iVar17 + -1 + iVar43) * iVar1;
            iVar17 = (iVar17 + -1 + iVar16) * iVar1;
            lVar29 = 0;
            do {
              iVar40 = (int)lVar29;
              auVar69._0_4_ = (float)(iVar40 + -0xc);
              auVar69._4_12_ = auVar76;
              auVar46 = vfmadd213ss_fma(auVar69,auVar47,ZEXT416((uint)fVar3));
              iVar25 = (int)auVar46._0_4_;
              auVar72._0_4_ = (float)(iVar40 + -0xb);
              auVar72._4_12_ = auVar76;
              auVar46 = vfmadd213ss_fma(auVar72,auVar47,ZEXT416((uint)fVar3));
              auVar70._0_4_ = (float)(iVar40 + -10);
              auVar70._4_12_ = auVar76;
              iVar20 = iVar25 + -1 + iVar43;
              iVar44 = iVar25 + -1 + iVar16;
              fVar60 = pfVar36[iVar19 + -1 + iVar25];
              fVar64 = pfVar36[iVar17 + -1 + iVar25];
              fVar73 = pfVar36[iVar44 + iVar17];
              iVar31 = (int)auVar46._0_4_;
              auVar46 = vfmadd213ss_fma(auVar70,auVar47,ZEXT416((uint)fVar3));
              fVar5 = pfVar36[iVar18 + -1 + iVar25];
              fVar6 = pfVar36[iVar18 + iVar44];
              auVar49 = SUB6416(ZEXT464(0x40000000),0);
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar36[iVar18 + iVar20] -
                                                      pfVar36[iVar20 + iVar17])),auVar49,
                                        ZEXT416((uint)(fVar73 - fVar5)));
              fVar65 = pfVar36[iVar19 + iVar44];
              pfVar38[lVar29 + -2] = (fVar64 - fVar6) + auVar48._0_4_;
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(fVar60 - fVar65)),auVar49,
                                        ZEXT416((uint)(fVar73 - fVar5)));
              pfVar45[lVar29 + -2] = auVar48._0_4_ - (fVar64 - fVar6);
              iVar44 = iVar31 + -1 + iVar43;
              iVar25 = iVar31 + -1 + iVar16;
              fVar60 = pfVar36[iVar19 + -1 + iVar31];
              fVar64 = pfVar36[iVar17 + -1 + iVar31];
              fVar73 = pfVar36[iVar25 + iVar17];
              iVar20 = (int)auVar46._0_4_;
              fVar5 = pfVar36[iVar18 + -1 + iVar31];
              fVar6 = pfVar36[iVar18 + iVar25];
              auVar46 = vfmadd213ss_fma(ZEXT416((uint)(pfVar36[iVar18 + iVar44] -
                                                      pfVar36[iVar44 + iVar17])),auVar49,
                                        ZEXT416((uint)(fVar73 - fVar5)));
              fVar65 = pfVar36[iVar19 + iVar25];
              pfVar38[lVar29 + -1] = (fVar64 - fVar6) + auVar46._0_4_;
              auVar46 = vfmadd213ss_fma(ZEXT416((uint)(fVar60 - fVar65)),auVar49,
                                        ZEXT416((uint)(fVar73 - fVar5)));
              iVar44 = iVar20 + -1 + iVar43;
              iVar25 = iVar20 + -1 + iVar16;
              pfVar45[lVar29 + -1] = auVar46._0_4_ - (fVar64 - fVar6);
              fVar60 = pfVar36[iVar19 + -1 + iVar20];
              fVar64 = pfVar36[iVar17 + -1 + iVar20];
              fVar73 = pfVar36[iVar25 + iVar17];
              fVar5 = pfVar36[iVar18 + -1 + iVar20];
              fVar6 = pfVar36[iVar18 + iVar25];
              fVar65 = pfVar36[iVar19 + iVar25];
              auVar46 = vfmadd213ss_fma(ZEXT416((uint)(pfVar36[iVar18 + iVar44] -
                                                      pfVar36[iVar44 + iVar17])),auVar49,
                                        ZEXT416((uint)(fVar73 - fVar5)));
              pfVar38[lVar29] = (fVar64 - fVar6) + auVar46._0_4_;
              auVar46 = vfmadd213ss_fma(ZEXT416((uint)(fVar60 - fVar65)),auVar49,
                                        ZEXT416((uint)(fVar73 - fVar5)));
              pfVar45[lVar29] = auVar46._0_4_ - (fVar64 - fVar6);
              lVar29 = lVar29 + 3;
            } while (iVar40 + -0xc < 9);
            iVar32 = iVar32 + 1;
            lVar22 = lVar22 + 1;
            pfVar45 = pfVar45 + 0x18;
            pfVar38 = pfVar38 + 0x18;
          } while (lVar22 != 0x18);
          goto LAB_001a2833;
        }
      }
    }
  }
  iVar1 = iVar43 * 2;
  iVar16 = -0xc;
  lVar29 = 0;
  lVar22 = 0;
  do {
    auVar61._0_4_ = (float)iVar16;
    auVar61._4_12_ = in_ZMM8._4_12_;
    auVar46 = vfmadd213ss_fma(auVar61,auVar79._0_16_,ZEXT416((uint)fVar4));
    fVar60 = auVar46._0_4_;
    iVar40 = (int)((double)((ulong)(0.0 <= fVar60) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar60) * -0x4020000000000000) + (double)fVar60);
    iVar17 = iVar1 + iVar40;
    iVar18 = iVar40 + -1;
    iVar19 = iVar40 + -1 + iVar43;
    lVar28 = lVar29;
    iVar32 = -0xc;
    do {
      auVar62._0_4_ = (float)iVar32;
      auVar76 = in_ZMM8._4_12_;
      auVar62._4_12_ = auVar76;
      auVar49 = auVar79._0_16_;
      auVar46 = vfmadd213ss_fma(auVar62,auVar49,ZEXT416((uint)fVar3));
      auVar74._0_4_ = (float)(iVar32 + 1);
      auVar74._4_12_ = auVar76;
      auVar48 = vfmadd213ss_fma(auVar74,auVar49,ZEXT416((uint)fVar3));
      fVar73 = auVar48._0_4_;
      auVar66._0_4_ = (float)(iVar32 + 2);
      auVar66._4_12_ = auVar76;
      auVar48 = vfmadd213ss_fma(auVar66,auVar49,ZEXT416((uint)fVar3));
      fVar60 = auVar46._0_4_;
      fVar64 = auVar48._0_4_;
      pfVar36 = (float *)((long)haarResponseY + lVar28);
      iVar25 = (int)((double)((ulong)(0.0 <= fVar60) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar60) * -0x4020000000000000) + (double)fVar60);
      if ((((iVar40 < 1) || (iVar25 < 1)) || (iimage->height < iVar17)) ||
         (iVar20 = iVar1 + iVar25, iimage->width < iVar20)) {
        haarXY(iimage,iVar40,iVar25,iVar43,(float *)((long)haarResponseX + lVar28),pfVar36);
      }
      else {
        iVar31 = iVar25 + -1 + iVar43;
        pfVar45 = iimage->data;
        iVar44 = iimage->data_width;
        iVar39 = iVar44 * iVar18;
        fVar60 = pfVar45[iVar44 * iVar19 + -1 + iVar25];
        iVar33 = iVar44 * (iVar1 + -1 + iVar40);
        fVar5 = pfVar45[iVar33 + -1 + iVar25];
        fVar6 = pfVar45[iVar33 + -1 + iVar20];
        fVar65 = pfVar45[iVar39 + -1 + iVar25];
        fVar7 = pfVar45[iVar39 + -1 + iVar20];
        fVar8 = pfVar45[iVar44 * iVar19 + -1 + iVar20];
        auVar46 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar39 + iVar31] - pfVar45[iVar33 + iVar31]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar65)));
        *(float *)((long)haarResponseX + lVar28) = (fVar5 - fVar7) + auVar46._0_4_;
        auVar46 = vfmadd213ss_fma(ZEXT416((uint)(fVar60 - fVar8)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar65)));
        *pfVar36 = auVar46._0_4_ - (fVar5 - fVar7);
      }
      iVar25 = (int)((double)((ulong)(0.0 <= fVar73) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar73) * -0x4020000000000000) + (double)fVar73);
      pfVar36 = (float *)((long)haarResponseX + lVar28 + 4);
      pfVar45 = (float *)((long)haarResponseY + lVar28 + 4);
      if (((iVar40 < 1) || (iVar25 < 1)) ||
         ((iimage->height < iVar17 || (iVar20 = iVar1 + iVar25, iimage->width < iVar20)))) {
        haarXY(iimage,iVar40,iVar25,iVar43,pfVar36,pfVar45);
      }
      else {
        iVar39 = iVar25 + -1 + iVar43;
        pfVar38 = iimage->data;
        iVar44 = iimage->data_width;
        iVar33 = iVar44 * iVar18;
        fVar60 = pfVar38[iVar44 * iVar19 + -1 + iVar25];
        iVar31 = iVar44 * (iVar1 + -1 + iVar40);
        fVar73 = pfVar38[iVar31 + -1 + iVar25];
        fVar5 = pfVar38[iVar31 + -1 + iVar20];
        fVar6 = pfVar38[iVar33 + -1 + iVar25];
        fVar65 = pfVar38[iVar33 + -1 + iVar20];
        fVar7 = pfVar38[iVar44 * iVar19 + -1 + iVar20];
        auVar46 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar33 + iVar39] - pfVar38[iVar31 + iVar39]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar36 = (fVar73 - fVar65) + auVar46._0_4_;
        auVar46 = vfmadd213ss_fma(ZEXT416((uint)(fVar60 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar45 = auVar46._0_4_ - (fVar73 - fVar65);
      }
      iVar25 = (int)((double)((ulong)(0.0 <= fVar64) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar64) * -0x4020000000000000) + (double)fVar64);
      pfVar36 = (float *)((long)haarResponseX + lVar28 + 8);
      pfVar45 = (float *)((long)haarResponseY + lVar28 + 8);
      if (((iVar40 < 1) || (iVar25 < 1)) ||
         ((iimage->height < iVar17 || (iVar20 = iVar1 + iVar25, iimage->width < iVar20)))) {
        haarXY(iimage,iVar40,iVar25,iVar43,pfVar36,pfVar45);
      }
      else {
        iVar31 = iVar25 + -1 + iVar43;
        pfVar38 = iimage->data;
        iVar44 = iimage->data_width;
        iVar39 = iVar44 * iVar18;
        fVar60 = pfVar38[iVar44 * iVar19 + -1 + iVar25];
        iVar33 = iVar44 * (iVar1 + -1 + iVar40);
        fVar64 = pfVar38[iVar33 + -1 + iVar25];
        fVar73 = pfVar38[iVar33 + -1 + iVar20];
        fVar5 = pfVar38[iVar39 + -1 + iVar25];
        fVar6 = pfVar38[iVar39 + -1 + iVar20];
        fVar65 = pfVar38[iVar44 * iVar19 + -1 + iVar20];
        auVar46 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar39 + iVar31] - pfVar38[iVar33 + iVar31]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar5)));
        *pfVar36 = (fVar64 - fVar6) + auVar46._0_4_;
        auVar46 = vfmadd213ss_fma(ZEXT416((uint)(fVar60 - fVar65)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar5)));
        *pfVar45 = auVar46._0_4_ - (fVar64 - fVar6);
      }
      auVar79 = ZEXT1664(auVar47);
      lVar28 = lVar28 + 0xc;
      bVar2 = iVar32 < 9;
      iVar32 = iVar32 + 3;
    } while (bVar2);
    iVar16 = iVar16 + 1;
    lVar22 = lVar22 + 1;
    lVar29 = lVar29 + 0x60;
  } while (lVar22 != 0x18);
LAB_001a2833:
  fVar60 = auVar79._0_4_;
  auVar78._8_4_ = 0x3effffff;
  auVar78._0_8_ = 0x3effffff3effffff;
  auVar78._12_4_ = 0x3effffff;
  auVar77._8_4_ = 0x80000000;
  auVar77._0_8_ = 0x8000000080000000;
  auVar77._12_4_ = 0x80000000;
  auVar46 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar60 * 0.5)),auVar77,0xf8);
  auVar46 = ZEXT416((uint)(fVar60 * 0.5 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar60 * 1.5)),auVar77,0xf8);
  auVar47 = ZEXT416((uint)(fVar60 * 1.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar60 * 2.5)),auVar77,0xf8);
  auVar48 = ZEXT416((uint)(fVar60 * 2.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar60 * 3.5)),auVar77,0xf8);
  auVar49 = ZEXT416((uint)(fVar60 * 3.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar60 * 4.5)),auVar77,0xf8);
  auVar50 = ZEXT416((uint)(fVar60 * 4.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar60 * 5.5)),auVar77,0xf8);
  auVar51 = ZEXT416((uint)(fVar60 * 5.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar60 * 6.5)),auVar77,0xf8);
  auVar52 = ZEXT416((uint)(fVar60 * 6.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar60 * 7.5)),auVar77,0xf8);
  auVar53 = ZEXT416((uint)(auVar53._0_4_ + fVar60 * 7.5));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar60 * 8.5)),auVar77,0xf8);
  auVar54 = ZEXT416((uint)(fVar60 * 8.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar60 * 9.5)),auVar77,0xf8);
  auVar55 = ZEXT416((uint)(fVar60 * 9.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar60 * 10.5)),auVar77,0xf8);
  auVar56 = ZEXT416((uint)(fVar60 * 10.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar60 * 11.5)),auVar77,0xf8);
  auVar57 = ZEXT416((uint)(fVar60 * 11.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  fVar65 = auVar48._0_4_;
  fVar60 = fVar65 + auVar47._0_4_;
  fVar3 = fVar65 + auVar46._0_4_;
  fVar4 = fVar65 - auVar46._0_4_;
  fVar64 = fVar65 - auVar47._0_4_;
  fVar73 = fVar65 - auVar49._0_4_;
  fVar5 = fVar65 - auVar50._0_4_;
  fVar6 = fVar65 - auVar51._0_4_;
  fVar65 = fVar65 - auVar52._0_4_;
  fVar75 = auVar53._0_4_;
  fVar7 = fVar75 - auVar49._0_4_;
  fVar8 = fVar75 - auVar50._0_4_;
  fVar9 = fVar75 - auVar51._0_4_;
  fVar10 = fVar75 - auVar52._0_4_;
  fVar11 = fVar75 - auVar54._0_4_;
  fVar12 = fVar75 - auVar55._0_4_;
  fVar13 = fVar75 - auVar56._0_4_;
  fVar75 = fVar75 - auVar57._0_4_;
  gauss_s1_c0[0] = expf(fVar60 * fVar60 * fVar59);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar59);
  gauss_s1_c0[2] = expf(fVar4 * fVar4 * fVar59);
  gauss_s1_c0[3] = expf(fVar64 * fVar64 * fVar59);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar73 * fVar73 * fVar59);
  gauss_s1_c0[6] = expf(fVar5 * fVar5 * fVar59);
  gauss_s1_c0[7] = expf(fVar6 * fVar6 * fVar59);
  gauss_s1_c0[8] = expf(fVar65 * fVar65 * fVar59);
  gauss_s1_c1[0] = expf(fVar7 * fVar7 * fVar59);
  gauss_s1_c1[1] = expf(fVar8 * fVar8 * fVar59);
  gauss_s1_c1[2] = expf(fVar9 * fVar9 * fVar59);
  gauss_s1_c1[3] = expf(fVar10 * fVar10 * fVar59);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar11 * fVar11 * fVar59);
  gauss_s1_c1[6] = expf(fVar12 * fVar12 * fVar59);
  gauss_s1_c1[7] = expf(fVar13 * fVar13 * fVar59);
  gauss_s1_c1[8] = expf(fVar75 * fVar75 * fVar59);
  uVar23 = 0xfffffff8;
  lVar22 = 0;
  fVar60 = 0.0;
  auVar63._8_4_ = 0x7fffffff;
  auVar63._0_8_ = 0x7fffffff7fffffff;
  auVar63._12_4_ = 0x7fffffff;
  lVar29 = 0;
  lVar28 = 0;
  do {
    pfVar36 = gauss_s1_c1;
    uVar21 = (uint)uVar23;
    if (uVar21 != 7) {
      pfVar36 = gauss_s1_c0;
    }
    if (uVar21 == 0xfffffff8) {
      pfVar36 = gauss_s1_c1;
    }
    lVar29 = (long)(int)lVar29;
    iVar43 = (int)lVar28;
    lVar28 = (long)iVar43;
    lVar35 = (long)haarResponseX + lVar22;
    lVar27 = (long)haarResponseY + lVar22;
    uVar34 = 0xfffffff8;
    uVar30 = 0;
    do {
      pfVar45 = gauss_s1_c1;
      if (uVar34 != 7) {
        pfVar45 = gauss_s1_c0;
      }
      if (uVar34 == 0xfffffff8) {
        pfVar45 = gauss_s1_c1;
      }
      uVar24 = (ulong)(uVar34 >> 0x1c & 0xfffffff8);
      auVar79 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar26 = uVar30;
      lVar41 = lVar35;
      lVar42 = lVar27;
      do {
        lVar37 = 0;
        pfVar38 = (float *)((long)pfVar36 + (ulong)(uint)((int)(uVar23 >> 0x1f) << 5));
        do {
          fVar3 = pfVar45[uVar24] * *pfVar38;
          auVar46 = vinsertps_avx(ZEXT416(*(uint *)(lVar42 + lVar37 * 4)),
                                  ZEXT416(*(uint *)(lVar41 + lVar37 * 4)),0x10);
          auVar71._0_4_ = fVar3 * auVar46._0_4_;
          auVar71._4_4_ = fVar3 * auVar46._4_4_;
          auVar71._8_4_ = fVar3 * auVar46._8_4_;
          auVar71._12_4_ = fVar3 * auVar46._12_4_;
          auVar46 = vandps_avx(auVar71,auVar63);
          auVar46 = vmovlhps_avx(auVar71,auVar46);
          auVar67._0_4_ = auVar79._0_4_ + auVar46._0_4_;
          auVar67._4_4_ = auVar79._4_4_ + auVar46._4_4_;
          auVar67._8_4_ = auVar79._8_4_ + auVar46._8_4_;
          auVar67._12_4_ = auVar79._12_4_ + auVar46._12_4_;
          auVar79 = ZEXT1664(auVar67);
          pfVar38 = pfVar38 + (ulong)(~uVar21 >> 0x1f) * 2 + -1;
          lVar37 = lVar37 + 1;
        } while (lVar37 != 9);
        uVar26 = uVar26 + 0x18;
        uVar24 = uVar24 + (ulong)(-1 < (int)uVar34) * 2 + -1;
        lVar41 = lVar41 + 0x60;
        lVar42 = lVar42 + 0x60;
      } while (uVar26 < uVar34 * 0x18 + 0x198);
      fVar3 = gauss_s2_arr[lVar28];
      auVar15._4_4_ = fVar3;
      auVar15._0_4_ = fVar3;
      auVar15._8_4_ = fVar3;
      auVar15._12_4_ = fVar3;
      auVar48 = vmulps_avx512vl(auVar67,auVar15);
      lVar28 = lVar28 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar29) = auVar48;
      auVar68._0_4_ = auVar48._0_4_ * auVar48._0_4_;
      auVar68._4_4_ = auVar48._4_4_ * auVar48._4_4_;
      auVar68._8_4_ = auVar48._8_4_ * auVar48._8_4_;
      auVar68._12_4_ = auVar48._12_4_ * auVar48._12_4_;
      auVar46 = vmovshdup_avx(auVar68);
      auVar47 = vfmadd231ss_fma(auVar46,auVar48,auVar48);
      auVar46 = vshufpd_avx(auVar48,auVar48,1);
      auVar47 = vfmadd213ss_fma(auVar46,auVar46,auVar47);
      auVar46 = vshufps_avx(auVar48,auVar48,0xff);
      auVar46 = vfmadd213ss_fma(auVar46,auVar46,auVar47);
      fVar60 = fVar60 + auVar46._0_4_;
      lVar29 = lVar29 + 4;
      uVar34 = uVar34 + 5;
      uVar30 = uVar30 + 0x78;
      lVar35 = lVar35 + 0x1e0;
      lVar27 = lVar27 + 0x1e0;
    } while (iVar43 + 4 != (int)lVar28);
    lVar22 = lVar22 + 0x14;
    uVar23 = (ulong)(uVar21 + 5);
  } while ((int)uVar21 < 3);
  if (fVar60 < 0.0) {
    fVar60 = sqrtf(fVar60);
  }
  else {
    auVar46 = vsqrtss_avx(ZEXT416((uint)fVar60),ZEXT416((uint)fVar60));
    fVar60 = auVar46._0_4_;
  }
  auVar79 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar60)));
  lVar22 = 0;
  do {
    auVar58 = vmulps_avx512f(auVar79,*(undefined1 (*) [64])(ipoint->descriptor + lVar22));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar22) = auVar58;
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_1_3_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}